

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic.c++
# Opt level: O0

void __thiscall capnp::DynamicStruct::Builder::verifySetInUnion(Builder *this,Field field)

{
  Field field_00;
  bool bVar1;
  Reader local_d8;
  ArrayPtr<const_char> local_a8;
  Reader local_98;
  ArrayPtr<const_char> local_68;
  Fault local_58;
  Fault f;
  undefined8 uStack_48;
  undefined8 local_40;
  undefined8 uStack_38;
  undefined8 local_30;
  undefined8 uStack_28;
  undefined8 local_20;
  undefined8 uStack_18;
  Builder *this_local;
  
  memcpy(&f,&field,0x40);
  field_00._8_8_ = uStack_48;
  field_00.parent.super_Schema.raw = (Schema)(Schema)f.exception;
  field_00.proto._reader.segment = (SegmentReader *)local_40;
  field_00.proto._reader.capTable = (CapTableReader *)uStack_38;
  field_00.proto._reader.data = (void *)local_30;
  field_00.proto._reader.pointers = (WirePointer *)uStack_28;
  field_00.proto._reader._32_8_ = local_20;
  field_00.proto._reader._40_8_ = uStack_18;
  bVar1 = isSetInUnion(this,field_00);
  if (!bVar1) {
    StructSchema::Field::getProto(&local_98,&field);
    local_68 = (ArrayPtr<const_char>)capnp::schema::Field::Reader::getName(&local_98);
    Schema::getProto(&local_d8,(Schema *)this);
    local_a8 = (ArrayPtr<const_char>)capnp::schema::Node::Reader::getDisplayName(&local_d8);
    kj::_::Debug::Fault::
    Fault<kj::Exception::Type,char_const(&)[66],capnp::Text::Reader,capnp::Text::Reader>
              (&local_58,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/dynamic.c++"
               ,0xa0,FAILED,"isSetInUnion(field)",
               "\"Tried to get() a union member which is not currently initialized.\", field.getProto().getName(), schema.getProto().getDisplayName()"
               ,(char (*) [66])"Tried to get() a union member which is not currently initialized.",
               (Reader *)&local_68,(Reader *)&local_a8);
    kj::_::Debug::Fault::fatal(&local_58);
  }
  return;
}

Assistant:

void DynamicStruct::Builder::verifySetInUnion(StructSchema::Field field) {
  KJ_REQUIRE(isSetInUnion(field),
      "Tried to get() a union member which is not currently initialized.",
      field.getProto().getName(), schema.getProto().getDisplayName());
}